

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall QWidgetTextControlPrivate::_q_documentLayoutChanged(QWidgetTextControlPrivate *this)

{
  Object *sender;
  Object *receiverPrivate;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractTextDocumentLayout *layout;
  QWidgetTextControl *q;
  offset_in_QWidgetTextControl_to_subr *in_stack_ffffffffffffff80;
  offset_in_QWidgetTextControl_to_subr *slot;
  code *context;
  Object *sender_00;
  offset_in_QAbstractTextDocumentLayout_to_subr in_stack_ffffffffffffffb0;
  Connection in_stack_ffffffffffffffc0;
  ConnectionType in_stack_ffffffffffffffd0;
  ConnectionType type;
  Connection local_28;
  code *local_20;
  undefined8 local_18;
  Connection local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sender = (Object *)q_func(in_RDI);
  receiverPrivate = (Object *)QTextDocument::documentLayout();
  local_20 = QWidgetTextControl::updateRequest;
  local_18 = 0;
  context = QAbstractTextDocumentLayout::update;
  sender_00 = (Object *)0x0;
  QObject::
  connect<void(QAbstractTextDocumentLayout::*)(QRectF_const&),void(QWidgetTextControl::*)(QRectF_const&)>
            ((Object *)0x0,in_stack_ffffffffffffffb0,
             (ContextType *)QAbstractTextDocumentLayout::update,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffffd0);
  QMetaObject::Connection::~Connection(&local_10);
  slot = (offset_in_QWidgetTextControl_to_subr *)0x0;
  type = AutoConnection;
  QObjectPrivate::
  connect<void(QAbstractTextDocumentLayout::*)(QTextBlock_const&),void(QWidgetTextControlPrivate::*)(QTextBlock_const&)>
            (sender,0,receiverPrivate,(Function)in_stack_ffffffffffffffc0.d_ptr,
             (ConnectionType)((ulong)sender_00 >> 0x20));
  QMetaObject::Connection::~Connection(&local_28);
  QObject::
  connect<void(QAbstractTextDocumentLayout::*)(QSizeF_const&),void(QWidgetTextControl::*)(QSizeF_const&)>
            (sender_00,
             (offset_in_QAbstractTextDocumentLayout_to_subr)QWidgetTextControl::documentSizeChanged,
             (ContextType *)context,slot,type);
  QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffc0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::_q_documentLayoutChanged()
{
    Q_Q(QWidgetTextControl);
    QAbstractTextDocumentLayout *layout = doc->documentLayout();
    QObject::connect(layout, &QAbstractTextDocumentLayout::update, q,
                     &QWidgetTextControl::updateRequest);
    QObjectPrivate::connect(layout, &QAbstractTextDocumentLayout::updateBlock, this,
                            &QWidgetTextControlPrivate::_q_updateBlock);
    QObject::connect(layout, &QAbstractTextDocumentLayout::documentSizeChanged, q,
                     &QWidgetTextControl::documentSizeChanged);
}